

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<3> f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  f_00;
  ulong uVar4;
  ulong size;
  align_spec as;
  align_spec local_60;
  char *local_50;
  size_t sStack_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long lStack_38;
  unsigned_type local_30;
  uint uStack_28;
  undefined4 uStack_24;
  
  sStack_48 = prefix.size_;
  local_50 = prefix.data_;
  uVar1 = num_digits + sStack_48;
  local_40 = (undefined1)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    lStack_38 = 0;
    if (uVar1 <= uVar4) {
      lStack_38 = uVar4 - uVar1;
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    iVar3 = spec->precision_;
    lStack_38 = 0;
    size = uVar1;
    if ((int)num_digits < iVar3) {
      size = (long)iVar3 + sStack_48;
    }
    if ((int)num_digits < iVar3) {
      lStack_38 = (long)iVar3 - (ulong)num_digits;
      local_40 = 0x30;
    }
    local_60.align_ = (spec->super_align_spec).align_;
    local_60.width_ = (spec->super_align_spec).width_;
    local_60.fill_ = (spec->super_align_spec).fill_;
    if (aVar2 == ALIGN_DEFAULT) {
      local_60.align_ = ALIGN_RIGHT;
    }
  }
  local_30 = f.abs_value;
  uStack_28 = f.num_digits;
  uStack_24 = f._12_4_;
  f_00._17_7_ = uStack_3f;
  f_00.fill = local_40;
  f_00.prefix = prefix;
  f_00.padding = lStack_38;
  f_00.f.abs_value = f.abs_value;
  f_00.f.num_digits = f.num_digits;
  f_00.f._12_4_ = f._12_4_;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
            (this,size,&local_60,f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }